

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogFileHourly.cpp
# Opt level: O2

void __thiscall liblogger::LogFileHourly::Rotate(LogFileHourly *this)

{
  int iVar1;
  ostream *poVar2;
  int *piVar3;
  char *pcVar4;
  LogException *this_00;
  string local_1c0;
  stringstream ss;
  ostream local_190 [376];
  
  if ((FILE *)this->m_fp != (FILE *)0x0) {
    iVar1 = fclose((FILE *)this->m_fp);
    if (iVar1 < 0) {
      std::__cxx11::stringstream::stringstream((stringstream *)&ss);
      poVar2 = std::operator<<(local_190,"Cannot close file: \'");
      poVar2 = std::operator<<(poVar2,(string *)&this->m_fname);
      poVar2 = std::operator<<(poVar2,"\' error: ");
      piVar3 = __errno_location();
      pcVar4 = strerror(*piVar3);
      std::operator<<(poVar2,pcVar4);
      this_00 = (LogException *)__cxa_allocate_exception(0x28);
      std::__cxx11::stringbuf::str();
      LogException::LogException(this_00,&local_1c0);
      __cxa_throw(this_00,&LogException::typeinfo,LogException::~LogException);
    }
    this->m_fp = (FILE *)0x0;
  }
  RemoveOld(this);
  return;
}

Assistant:

void LogFileHourly::Rotate()
{
	if (m_fp != NULL)
	{
		if (fclose(m_fp) < 0)
		{
			std::stringstream ss;
			ss << "Cannot close file: '" << m_fname << "' error: " << strerror(errno);
			throw(LogException(ss.str()));
		}
		m_fp = NULL;
	}
	RemoveOld();
}